

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
pegmatite::AsciiFileInput::fillBuffer(AsciiFileInput *this,Index start,Index *length,char32_t **b)

{
  unsigned_long *puVar1;
  ssize_t sVar2;
  ulong local_258;
  Index i;
  ssize_t ret;
  Index bytes_to_read;
  char local_238 [8];
  char buffer [512];
  char32_t **b_local;
  Index *length_local;
  Index start_local;
  AsciiFileInput *this_local;
  
  if (this->file_size < start) {
    this_local._7_1_ = false;
  }
  else {
    puVar1 = std::min<unsigned_long>(length,&Input::static_buffer_size);
    *length = *puVar1;
    bytes_to_read = this->file_size - start;
    puVar1 = std::min<unsigned_long>(length,&bytes_to_read);
    *length = *puVar1;
    ret = *length;
    do {
      sVar2 = pread(this->fd,local_238,*length,start);
      if (sVar2 < 1) {
        return false;
      }
      ret = ret - *length;
    } while (ret != 0);
    for (local_258 = 0; local_258 < *length; local_258 = local_258 + 1) {
      (*b)[local_258] = (int)local_238[local_258];
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiFileInput::fillBuffer(Index start, Index &length, char32_t *&b)
{
	if (start > file_size)
	{
		return false;
	}
	char buffer[static_buffer_size];
	// This should be a no-op
	length = std::min(length, static_buffer_size);
	length = std::min(length, file_size - start);
	Index bytes_to_read = length;
	do {
		ssize_t ret = pread(fd, buffer, length,
		                    static_cast<off_t>(start));
		if (ret < 1)
		{
			return false;
		}
		bytes_to_read -= length;
	} while (bytes_to_read > 0);
	for (Index i=0 ; i<length ; i++)
	{
		b[i] = static_cast<char32_t>(buffer[i]);
	}
	return true;
}